

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtl.cpp
# Opt level: O2

void __thiscall
pg::RTLSolver::attractVertices(RTLSolver *this,int pl,int v,bitset *R,bitset *Z,bitset *G,int maxpr)

{
  ulong *puVar1;
  uint vertex;
  Game *pGVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  int *piVar6;
  ulong uVar7;
  uint *puVar8;
  char *pcVar9;
  ulong uVar10;
  ulong uVar11;
  int from;
  ulong uVar12;
  _label_vertex local_50;
  bitset *local_40;
  bitset *local_38;
  
  pGVar2 = (this->super_Solver).game;
  puVar8 = (uint *)(pGVar2->_inedges + pGVar2->_firstins[v]);
  local_40 = G;
  local_38 = R;
  do {
    vertex = *puVar8;
    uVar12 = (ulong)(int)vertex;
    if (uVar12 == 0xffffffffffffffff) {
      return;
    }
    uVar7 = uVar12 >> 6;
    if ((Z->_bits[uVar7] >> (uVar12 & 0x3f) & 1) == 0) {
      uVar11 = 1L << (uVar12 & 0x3f);
      if (((local_38->_bits[uVar7] & uVar11) != 0) &&
         (((this->super_Solver).game)->_priority[uVar12] <= maxpr)) {
        iVar3 = Solver::owner(&this->super_Solver,vertex);
        if (iVar3 != pl) {
          pGVar2 = (this->super_Solver).game;
          for (piVar6 = pGVar2->_outedges + pGVar2->_firstouts[uVar12]; uVar10 = (ulong)*piVar6,
              uVar10 != 0xffffffffffffffff; piVar6 = piVar6 + 1) {
            if (((local_40->_bits[uVar10 >> 6] >> (uVar10 & 0x3f) & 1) != 0) &&
               ((Z->_bits[uVar10 >> 6] & 1L << (uVar10 & 0x3f)) == 0)) goto LAB_0015db25;
          }
        }
        puVar1 = Z->_bits + uVar7;
        *puVar1 = *puVar1 | uVar11;
        iVar4 = Solver::owner(&this->super_Solver,vertex);
        iVar3 = -1;
        if (iVar4 == pl) {
          iVar3 = v;
        }
        this->str[uVar12] = iVar3;
        iVar3 = (this->Q).pointer;
        (this->Q).pointer = iVar3 + 1;
        (this->Q).queue[iVar3] = vertex;
        if (2 < (this->super_Solver).trace) {
          poVar5 = std::operator<<((this->super_Solver).logger,"\x1b[1;37mattracted \x1b[36m");
          local_50.g = (this->super_Solver).game;
          local_50.v = vertex;
          poVar5 = operator<<(poVar5,&local_50);
          poVar5 = std::operator<<(poVar5,"\x1b[m by \x1b[1;36m");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,pl);
          std::operator<<(poVar5,"\x1b[m");
          iVar3 = Solver::owner(&this->super_Solver,vertex);
          poVar5 = (this->super_Solver).logger;
          if (iVar3 == pl) {
            poVar5 = std::operator<<(poVar5," (via ");
            local_50.g = (this->super_Solver).game;
            local_50.v = v;
            poVar5 = operator<<(poVar5,&local_50);
            pcVar9 = ")";
          }
          else {
            pcVar9 = " (forced)";
          }
          poVar5 = std::operator<<(poVar5,pcVar9);
          std::endl<char,std::char_traits<char>>(poVar5);
        }
      }
    }
    else {
      iVar3 = Solver::owner(&this->super_Solver,vertex);
      if ((iVar3 == pl) && (this->str[uVar12] == -1)) {
        this->str[uVar12] = v;
      }
    }
LAB_0015db25:
    puVar8 = puVar8 + 1;
  } while( true );
}

Assistant:

void
RTLSolver::attractVertices(int pl, int v, bitset &R, bitset &Z, bitset &G, int maxpr)
{
    // attract vertices with an edge to <v>
    for (auto curedge = ins(v); *curedge != -1; curedge++) {
        int from = *curedge;
        if (Z[from]) {
            // already in Z, maybe set strategy (for vertices in the original target set)
            if (owner(from) == pl and str[from] == -1) str[from] = v;
        } else if (R[from] && priority(from) <= maxpr) {
            if (owner(from) != pl) {
                // check if opponent can escape
                bool escapes = false;
                for (auto curedge = outs(from); *curedge != -1; curedge++) {
                    int to = *curedge;
                    if (G[to] and !Z[to]) {
                        escapes = true;
                        break;
                    }
                }
                if (escapes) continue;
            }
            // attract
            Z[from] = true;
            str[from] = owner(from) == pl ? v : -1;
            Q.push(from);
#ifndef NDEBUG
            // maybe report event
            if (trace >= 3) {
                logger << "\033[1;37mattracted \033[36m" << label_vertex(from) << "\033[m by \033[1;36m" << pl << "\033[m";
                if (owner(from) == pl) logger << " (via " << label_vertex(v) << ")" << std::endl;
                else logger << " (forced)" << std::endl;
            }
#endif
        }
    }
}